

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_help(Formatter *this,App *app,string *name,AppFormatMode mode)

{
  bool bVar1;
  App *pAVar2;
  string *psVar3;
  App *in_RDX;
  long *in_RSI;
  string *in_RDI;
  int in_R8D;
  stringstream out;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  undefined1 local_220 [32];
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [9];
  AppFormatMode in_stack_ffffffffffffff8c;
  App *in_stack_ffffffffffffff90;
  Formatter *in_stack_ffffffffffffff98;
  
  if (in_R8D == 2) {
    (**(code **)(*in_RSI + 0x38))(in_RDI,in_RSI,in_RDX);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b0);
    App::get_name_abi_cxx11_(in_RDX);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18c5a7
                      );
    if ((bVar1) && (pAVar2 = App::get_parent(in_RDX), pAVar2 != (App *)0x0)) {
      App::get_group_abi_cxx11_(in_RDX);
      bVar1 = ::std::operator==(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_fffffffffffffd28 = local_1a0;
        psVar3 = App::get_group_abi_cxx11_(in_RDX);
        in_stack_fffffffffffffd30 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::operator<<((ostream *)in_stack_fffffffffffffd28,(string *)psVar3);
        ::std::operator<<((ostream *)in_stack_fffffffffffffd30,':');
      }
    }
    (**(code **)(*in_RSI + 0x48))(local_1e0,in_RSI,in_RDX);
    ::std::operator<<((ostream *)local_1a0,local_1e0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    ::std::__cxx11::string::string(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    (**(code **)(*in_RSI + 0x50))(local_200,in_RSI,in_RDX,local_220);
    ::std::operator<<((ostream *)local_1a0,local_200);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    (**(code **)(*in_RSI + 0x20))(local_240,in_RSI,in_RDX);
    ::std::operator<<((ostream *)local_1a0,local_240);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    make_groups_abi_cxx11_
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    ::std::operator<<((ostream *)local_1a0,local_260);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    (**(code **)(*in_RSI + 0x28))(local_280,in_RSI,in_RDX,in_R8D);
    ::std::operator<<((ostream *)local_1a0,local_280);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffcf0);
    this_00 = local_1a0;
    (**(code **)(*in_RSI + 0x40))(local_2a0,in_RSI,in_RDX);
    ::std::operator<<((ostream *)this_00,local_2a0);
    ::std::__cxx11::string::~string(this_00);
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {

    // This immediately forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app);

    std::stringstream out;
    if((app->get_name().empty()) && (app->get_parent() != nullptr)) {
        if(app->get_group() != "Subcommands") {
            out << app->get_group() << ':';
        }
    }

    out << make_description(app);
    out << make_usage(app, name);
    out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    out << make_footer(app);

    return out.str();
}